

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

duckdb_logical_type duckdb_create_enum_type(char **member_names,idx_t member_count)

{
  char *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint uVar3;
  size_t sVar4;
  LogicalType *this_00;
  undefined8 in_RCX;
  data_ptr_t pdVar5;
  idx_t iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  string_t sVar11;
  Vector enum_vector;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  LogicalType local_e0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  LogicalType local_b0;
  Vector local_98;
  
  if (member_names == (char **)0x0) {
    this_00 = (LogicalType *)0x0;
  }
  else {
    duckdb::LogicalType::LogicalType(&local_b0,VARCHAR);
    duckdb::Vector::Vector(&local_98,&local_b0,member_count);
    duckdb::LogicalType::~LogicalType(&local_b0);
    if (member_count != 0) {
      pdVar5 = local_98.data + 8;
      iVar6 = 0;
      do {
        __s = member_names[iVar6];
        if (__s == (char *)0x0) {
          this_00 = (LogicalType *)0x0;
          goto LAB_0172ea36;
        }
        sVar4 = strlen(__s);
        uVar3 = (uint)sVar4;
        if (uVar3 < 0xd) {
          uStack_e4 = 0;
          uStack_ec = 0;
          uStack_e8 = 0;
          if (uVar3 != 0) {
            switchD_01602a8a::default(&uStack_ec,__s,(ulong)(uVar3 & 0xf));
          }
        }
        else {
          uStack_ec = *(undefined4 *)__s;
          uStack_e8 = SUB84(__s,0);
          uStack_e4 = (undefined4)((ulong)__s >> 0x20);
        }
        sVar11.value._4_1_ = (undefined1)uStack_e4;
        sVar11.value._5_1_ = uStack_e4._1_1_;
        sVar11.value._6_1_ = uStack_e4._2_1_;
        sVar11.value._7_1_ = uStack_e4._3_1_;
        sVar11.value.pointer.length = uStack_e8;
        sVar11.value.pointer.ptr = (char *)in_RCX;
        sVar11 = duckdb::StringVector::AddStringOrBlob
                           ((StringVector *)&local_98,(Vector *)CONCAT44(uStack_ec,uVar3),sVar11);
        *(long *)(pdVar5 + -8) = sVar11.value._0_8_;
        *(long *)pdVar5 = sVar11.value._8_8_;
        iVar6 = iVar6 + 1;
        pdVar5 = pdVar5 + 0x10;
      } while (member_count != iVar6);
    }
    this_00 = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this_00);
    duckdb::LogicalType::ENUM(&local_e0,&local_98,member_count);
    _Var2._M_pi = local_e0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar1 = local_e0.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00->id_ = local_e0.id_;
    this_00->physical_type_ = local_e0.physical_type_;
    uVar7 = *(undefined4 *)
             &(this_00->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = *(undefined4 *)
             ((long)&(this_00->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    uVar9 = *(undefined4 *)
             &(this_00->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar10 = *(undefined4 *)
              ((long)&(this_00->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (this_00->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_e0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (this_00->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this_00->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this_00->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c8 = uVar7;
      uStack_c4 = uVar8;
      uStack_c0 = uVar9;
      uStack_bc = uVar10;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      uVar7 = local_c8;
      uVar8 = uStack_c4;
      uVar9 = uStack_c0;
      uVar10 = uStack_bc;
    }
    _Var2._M_pi = local_e0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_e0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)CONCAT44(uVar8,uVar7);
    local_e0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         uVar10;
    local_e0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         uVar9;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    duckdb::LogicalType::~LogicalType(&local_e0);
LAB_0172ea36:
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    duckdb::LogicalType::~LogicalType(&local_98.type);
  }
  return (duckdb_logical_type)this_00;
}

Assistant:

duckdb_logical_type duckdb_create_enum_type(const char **member_names, idx_t member_count) {
	if (!member_names) {
		return nullptr;
	}
	duckdb::Vector enum_vector(duckdb::LogicalType::VARCHAR, member_count);
	auto enum_vector_ptr = duckdb::FlatVector::GetData<duckdb::string_t>(enum_vector);

	for (idx_t i = 0; i < member_count; i++) {
		if (!member_names[i]) {
			return nullptr;
		}
		enum_vector_ptr[i] = duckdb::StringVector::AddStringOrBlob(enum_vector, member_names[i]);
	}

	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	*mtype = duckdb::LogicalType::ENUM(enum_vector, member_count);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}